

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int share_xchannel_us_cmp(void *av,void *bv)

{
  share_xchannel *b;
  share_xchannel *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int share_xchannel_us_cmp(void *av, void *bv)
{
    const struct share_xchannel *a = (const struct share_xchannel *)av;
    const struct share_xchannel *b = (const struct share_xchannel *)bv;

    if (a->upstream_id < b->upstream_id)
        return -1;
    else if (a->upstream_id > b->upstream_id)
        return +1;
    else
        return 0;
}